

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O2

void Test_TemplateModifiers_ValidateImgSrcUrlHtmlEscape::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  TemplateString TVar14;
  int iVar15;
  char *pcVar16;
  char *pcVar17;
  TemplateDictionaryPeer peer;
  TemplateString local_258;
  TemplateString local_238;
  TemplateString local_218;
  TemplateString local_1f8;
  TemplateString local_1d8;
  TemplateString local_1b8;
  TemplateString local_198;
  TemplateString local_178;
  TemplateString local_158;
  TemplateString local_138;
  TemplateString local_118;
  TemplateString local_f8;
  TemplateString local_d8;
  TemplateString local_b8;
  TemplateString local_98;
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString(&local_258,"TestValidateImgSrcUrlHtmlEscape");
  ctemplate::TemplateDictionary::TemplateDictionary(&dict,&local_258,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_98,"easy http URL");
  ctemplate::TemplateString::TemplateString(&local_b8,"http://www.google.com");
  TVar1.length_ = local_98.length_;
  TVar1.ptr_ = local_98.ptr_;
  TVar1.is_immutable_ = local_98.is_immutable_;
  TVar1._17_7_ = local_98._17_7_;
  TVar1.id_ = local_98.id_;
  TVar8.length_ = local_b8.length_;
  TVar8.ptr_ = local_b8.ptr_;
  TVar8.is_immutable_ = local_b8.is_immutable_;
  TVar8._17_7_ = local_b8._17_7_;
  TVar8.id_ = local_b8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar1,TVar8,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_d8,"harder https URL");
  ctemplate::TemplateString::TemplateString(&local_f8,"https://www.google.com/search?q=f&hl=en");
  TVar2.length_ = local_d8.length_;
  TVar2.ptr_ = local_d8.ptr_;
  TVar2.is_immutable_ = local_d8.is_immutable_;
  TVar2._17_7_ = local_d8._17_7_;
  TVar2.id_ = local_d8.id_;
  TVar9.length_ = local_f8.length_;
  TVar9.ptr_ = local_f8.ptr_;
  TVar9.is_immutable_ = local_f8.is_immutable_;
  TVar9._17_7_ = local_f8._17_7_;
  TVar9.id_ = local_f8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar2,TVar9,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_118,"easy javascript URL");
  ctemplate::TemplateString::TemplateString(&local_138,"javascript:alert(document.cookie)");
  TVar3.length_ = local_118.length_;
  TVar3.ptr_ = local_118.ptr_;
  TVar3.is_immutable_ = local_118.is_immutable_;
  TVar3._17_7_ = local_118._17_7_;
  TVar3.id_ = local_118.id_;
  TVar10.length_ = local_138.length_;
  TVar10.ptr_ = local_138.ptr_;
  TVar10.is_immutable_ = local_138.is_immutable_;
  TVar10._17_7_ = local_138._17_7_;
  TVar10.id_ = local_138.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar3,TVar10,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_158,"harder javascript URL");
  ctemplate::TemplateString::TemplateString(&local_178,"javascript:alert(10/5)");
  TVar4.length_ = local_158.length_;
  TVar4.ptr_ = local_158.ptr_;
  TVar4.is_immutable_ = local_158.is_immutable_;
  TVar4._17_7_ = local_158._17_7_;
  TVar4.id_ = local_158.id_;
  TVar11.length_ = local_178.length_;
  TVar11.ptr_ = local_178.ptr_;
  TVar11.is_immutable_ = local_178.is_immutable_;
  TVar11._17_7_ = local_178._17_7_;
  TVar11.id_ = local_178.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar4,TVar11,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_198,"easy relative URL");
  ctemplate::TemplateString::TemplateString(&local_1b8,"foobar.html");
  TVar5.length_ = local_198.length_;
  TVar5.ptr_ = local_198.ptr_;
  TVar5.is_immutable_ = local_198.is_immutable_;
  TVar5._17_7_ = local_198._17_7_;
  TVar5.id_ = local_198.id_;
  TVar12.length_ = local_1b8.length_;
  TVar12.ptr_ = local_1b8.ptr_;
  TVar12.is_immutable_ = local_1b8.is_immutable_;
  TVar12._17_7_ = local_1b8._17_7_;
  TVar12.id_ = local_1b8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar5,TVar12,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_1d8,"harder relative URL");
  ctemplate::TemplateString::TemplateString(&local_1f8,"/search?q=green flowers&hl=en");
  TVar6.length_ = local_1d8.length_;
  TVar6.ptr_ = local_1d8.ptr_;
  TVar6.is_immutable_ = local_1d8.is_immutable_;
  TVar6._17_7_ = local_1d8._17_7_;
  TVar6.id_ = local_1d8.id_;
  TVar13.length_ = local_1f8.length_;
  TVar13.ptr_ = local_1f8.ptr_;
  TVar13.is_immutable_ = local_1f8.is_immutable_;
  TVar13._17_7_ = local_1f8._17_7_;
  TVar13.id_ = local_1f8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar6,TVar13,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_218,"ftp URL");
  ctemplate::TemplateString::TemplateString(&local_238,"ftp://ftp.example.org/pub/file.txt");
  TVar7.length_ = local_218.length_;
  TVar7.ptr_ = local_218.ptr_;
  TVar7.is_immutable_ = local_218.is_immutable_;
  TVar7._17_7_ = local_218._17_7_;
  TVar7.id_ = local_218.id_;
  TVar14.length_ = local_238.length_;
  TVar14.ptr_ = local_238.ptr_;
  TVar14.is_immutable_ = local_238.is_immutable_;
  TVar14._17_7_ = local_238._17_7_;
  TVar14.id_ = local_238.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar7,TVar14,(TemplateModifier *)&dict);
  peer.dict_ = &dict;
  ctemplate::TemplateString::TemplateString(&local_258,"easy http URL");
  pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_258);
  iVar15 = strcmp(pcVar16,"http://www.google.com");
  if (iVar15 == 0) {
    ctemplate::TemplateString::TemplateString(&local_258,"harder https URL");
    pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_258);
    iVar15 = strcmp(pcVar16,"https://www.google.com/search?q=f&amp;hl=en");
    if (iVar15 == 0) {
      ctemplate::TemplateString::TemplateString(&local_258,"easy javascript URL");
      pcVar17 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_258);
      pcVar16 = ctemplate::ValidateUrl::kUnsafeImgSrcUrlReplacement;
      iVar15 = strcmp(pcVar17,ctemplate::ValidateUrl::kUnsafeImgSrcUrlReplacement);
      if (iVar15 == 0) {
        ctemplate::TemplateString::TemplateString(&local_258,"harder javascript URL");
        pcVar17 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_258);
        iVar15 = strcmp(pcVar17,pcVar16);
        if (iVar15 == 0) {
          ctemplate::TemplateString::TemplateString(&local_258,"easy relative URL");
          pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_258);
          iVar15 = strcmp(pcVar16,"foobar.html");
          if (iVar15 == 0) {
            ctemplate::TemplateString::TemplateString(&local_258,"harder relative URL");
            pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_258);
            iVar15 = strcmp(pcVar16,"/search?q=green flowers&amp;hl=en");
            if (iVar15 == 0) {
              ctemplate::TemplateString::TemplateString(&local_258,"ftp URL");
              pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_258);
              iVar15 = strcmp(pcVar16,"ftp://ftp.example.org/pub/file.txt");
              if (iVar15 == 0) {
                ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
                return;
              }
              pcVar16 = 
              "strcmp(peer.GetSectionValue(\"ftp URL\"), \"ftp://ftp.example.org/pub/file.txt\") == 0"
              ;
            }
            else {
              pcVar16 = 
              "strcmp(peer.GetSectionValue(\"harder relative URL\"), \"/search?q=green flowers&amp;hl=en\") == 0"
              ;
            }
          }
          else {
            pcVar16 = "strcmp(peer.GetSectionValue(\"easy relative URL\"), \"foobar.html\") == 0";
          }
        }
        else {
          pcVar16 = 
          "strcmp(peer.GetSectionValue(\"harder javascript URL\"), ctemplate::ValidateUrl::kUnsafeImgSrcUrlReplacement) == 0"
          ;
        }
      }
      else {
        pcVar16 = 
        "strcmp(peer.GetSectionValue(\"easy javascript URL\"), ctemplate::ValidateUrl::kUnsafeImgSrcUrlReplacement) == 0"
        ;
      }
    }
    else {
      pcVar16 = 
      "strcmp(peer.GetSectionValue(\"harder https URL\"), \"https://www.google.com/search?q=f&amp;hl=en\") == 0"
      ;
    }
  }
  else {
    pcVar16 = "strcmp(peer.GetSectionValue(\"easy http URL\"), \"http://www.google.com\") == 0";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar16);
  exit(1);
}

Assistant:

TEST(TemplateModifiers, ValidateImgSrcUrlHtmlEscape) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestValidateImgSrcUrlHtmlEscape", NULL);
  dict.SetEscapedValue("easy http URL", "http://www.google.com",
                       GOOGLE_NAMESPACE::validate_img_src_url_and_html_escape);
  dict.SetEscapedValue("harder https URL",
                       "https://www.google.com/search?q=f&hl=en",
                       GOOGLE_NAMESPACE::validate_img_src_url_and_html_escape);
  dict.SetEscapedValue("easy javascript URL",
                       "javascript:alert(document.cookie)",
                       GOOGLE_NAMESPACE::validate_img_src_url_and_html_escape);
  dict.SetEscapedValue("harder javascript URL",
                       "javascript:alert(10/5)",
                       GOOGLE_NAMESPACE::validate_img_src_url_and_html_escape);
  dict.SetEscapedValue("easy relative URL",
                       "foobar.html",
                       GOOGLE_NAMESPACE::validate_img_src_url_and_html_escape);
  dict.SetEscapedValue("harder relative URL",
                       "/search?q=green flowers&hl=en",
                       GOOGLE_NAMESPACE::validate_img_src_url_and_html_escape);
  dict.SetEscapedValue("ftp URL",
                       "ftp://ftp.example.org/pub/file.txt",
                       GOOGLE_NAMESPACE::validate_img_src_url_and_html_escape);

  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("easy http URL"),
               "http://www.google.com");
  EXPECT_STREQ(peer.GetSectionValue("harder https URL"),
               "https://www.google.com/search?q=f&amp;hl=en");
  EXPECT_STREQ(peer.GetSectionValue("easy javascript URL"),
               GOOGLE_NAMESPACE::ValidateUrl::kUnsafeImgSrcUrlReplacement);
  EXPECT_STREQ(peer.GetSectionValue("harder javascript URL"),
               GOOGLE_NAMESPACE::ValidateUrl::kUnsafeImgSrcUrlReplacement);
  EXPECT_STREQ(peer.GetSectionValue("easy relative URL"),
               "foobar.html");
  EXPECT_STREQ(peer.GetSectionValue("harder relative URL"),
               "/search?q=green flowers&amp;hl=en");
  EXPECT_STREQ(peer.GetSectionValue("ftp URL"),
               "ftp://ftp.example.org/pub/file.txt");
}